

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

programDefinition * __thiscall
glcts::TextureCubeMapArraySamplingTest::programCollectionForFunction::getProgram
          (programCollectionForFunction *this,shaderType shader_type)

{
  shaderType shader_type_local;
  programCollectionForFunction *this_local;
  
  switch(shader_type) {
  case Compute:
    this_local = this;
    break;
  case Fragment:
    this_local = (programCollectionForFunction *)&this->program_with_sampling_fragment_shader;
    break;
  case Geometry:
    this_local = (programCollectionForFunction *)&this->program_with_sampling_geometry_shader;
    break;
  case Tesselation_Control:
    this_local = (programCollectionForFunction *)
                 &this->program_with_sampling_tesselation_control_shader;
    break;
  case Tesselation_Evaluation:
    this_local = (programCollectionForFunction *)
                 &this->program_with_sampling_tesselation_evaluation_shader;
    break;
  case Vertex:
    this_local = (programCollectionForFunction *)&this->program_with_sampling_vertex_shader;
    break;
  default:
    this_local = (programCollectionForFunction *)0x0;
  }
  return &this_local->program_with_sampling_compute_shader;
}

Assistant:

const TextureCubeMapArraySamplingTest::programDefinition* TextureCubeMapArraySamplingTest::
	programCollectionForFunction::getProgram(shaderType shader_type) const
{
	switch (shader_type)
	{
	case Compute:
		return &program_with_sampling_compute_shader;
		break;
	case Fragment:
		return &program_with_sampling_fragment_shader;
		break;
	case Geometry:
		return &program_with_sampling_geometry_shader;
		break;
	case Tesselation_Control:
		return &program_with_sampling_tesselation_control_shader;
		break;
	case Tesselation_Evaluation:
		return &program_with_sampling_tesselation_evaluation_shader;
		break;
	case Vertex:
		return &program_with_sampling_vertex_shader;
		break;
	}

	return 0;
}